

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:578:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:578:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *pvVar1;
  value *pvVar2;
  uint *puVar3;
  gc_heap_ptr_untyped local_68;
  gc_heap_ptr_untyped local_58;
  wstring_view local_48;
  
  pvVar2 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc8,pvVar2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc8);
  if (this_->type_ == object) {
    pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar2 == pvVar1) {
      local_48._M_str = L",";
      local_48._M_len = 1;
    }
    else {
      to_string((mjs *)&local_58,(this->f).global.super_gc_heap_ptr_untyped.heap_,pvVar2);
      puVar3 = (uint *)gc_heap_ptr_untyped::get(&local_58);
      local_48._M_str = (wchar_t *)(puVar3 + 1);
      local_48._M_len = (size_t)*puVar3;
    }
    anon_unknown_110::array_join((anon_unknown_110 *)&local_68,&(this_->field_1).o_,&local_48);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_68.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_68.pos_;
    if (local_68.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_68.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
    if (pvVar2 != pvVar1) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }